

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O2

int checkSanityOfKnownMonotone
              (Vec_Int_t *vKnownMonotone,Vec_Int_t *vCandMonotone,Vec_Int_t *vHintMonotone)

{
  uint uVar1;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < vKnownMonotone->nSize; iVar2 = iVar2 + 1) {
    uVar1 = Vec_IntEntry(vKnownMonotone,iVar2);
    printf("%d ",(ulong)uVar1);
  }
  putchar(10);
  for (iVar2 = 0; iVar2 < vCandMonotone->nSize; iVar2 = iVar2 + 1) {
    uVar1 = Vec_IntEntry(vCandMonotone,iVar2);
    printf("%d ",(ulong)uVar1);
  }
  putchar(10);
  for (iVar2 = 0; iVar2 < vHintMonotone->nSize; iVar2 = iVar2 + 1) {
    uVar1 = Vec_IntEntry(vHintMonotone,iVar2);
    printf("%d ",(ulong)uVar1);
  }
  putchar(10);
  return 1;
}

Assistant:

int checkSanityOfKnownMonotone( Vec_Int_t *vKnownMonotone, Vec_Int_t *vCandMonotone, Vec_Int_t *vHintMonotone )
{
    int iElem, i;

    Vec_IntForEachEntry( vKnownMonotone, iElem, i )
        printf("%d ", iElem);
    printf("\n");
    Vec_IntForEachEntry( vCandMonotone, iElem, i )
        printf("%d ", iElem);
    printf("\n");
    Vec_IntForEachEntry( vHintMonotone, iElem, i )
        printf("%d ", iElem);
    printf("\n");
    return 1;
}